

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O0

void convertToLevelAndOption(SocketOption opt,NetworkLayerProtocol socketProtocol,int *level,int *n)

{
  int *n_local;
  int *level_local;
  NetworkLayerProtocol socketProtocol_local;
  SocketOption opt_local;
  
  *n = -1;
  *level = 1;
  switch(opt) {
  case NonBlockingSocketOption:
  case BindExclusively:
  case MaxStreamsSocketOption:
  case BroadcastSocketOption:
    *n = 6;
    break;
  case ReceiveBufferSocketOption:
    *n = 8;
    break;
  case SendBufferSocketOption:
    *n = 7;
    break;
  case AddressReusable:
    *n = 2;
    break;
  case ReceiveOutOfBandData:
    *n = 10;
    break;
  case LowDelayOption:
    *level = 6;
    *n = 1;
    break;
  case KeepAliveOption:
    *n = 9;
    break;
  case MulticastTtlOption:
    if ((socketProtocol == IPv6Protocol) || (socketProtocol == AnyIPProtocol)) {
      *level = 0x29;
      *n = 0x12;
    }
    else {
      *level = 0;
      *n = 0x21;
    }
    break;
  case MulticastLoopbackOption:
    if ((socketProtocol == IPv6Protocol) || (socketProtocol == AnyIPProtocol)) {
      *level = 0x29;
      *n = 0x13;
    }
    else {
      *level = 0;
      *n = 0x22;
    }
    break;
  case TypeOfServiceOption:
    if (socketProtocol == IPv4Protocol) {
      *level = 0;
      *n = 1;
    }
    break;
  case ReceivePacketInformation:
    if ((socketProtocol == IPv6Protocol) || (socketProtocol == AnyIPProtocol)) {
      *level = 0x29;
      *n = 0x31;
    }
    else if (socketProtocol == IPv4Protocol) {
      *level = 0;
      *n = 8;
    }
    break;
  case ReceiveHopLimit:
    if ((socketProtocol == IPv6Protocol) || (socketProtocol == AnyIPProtocol)) {
      *level = 0x29;
      *n = 0x33;
    }
    else if (socketProtocol == IPv4Protocol) {
      *level = 0;
      *n = 0xc;
    }
    break;
  case PathMtuInformation:
    if ((socketProtocol == IPv6Protocol) || (socketProtocol == AnyIPProtocol)) {
      *level = 0x29;
      *n = 0x18;
    }
    else {
      *level = 0;
      *n = 0xe;
    }
  }
  return;
}

Assistant:

static void convertToLevelAndOption(QNativeSocketEngine::SocketOption opt,
                                    QAbstractSocket::NetworkLayerProtocol socketProtocol, int &level, int &n)
{
    n = -1;
    level = SOL_SOCKET; // default

    switch (opt) {
    case QNativeSocketEngine::NonBlockingSocketOption:  // fcntl, not setsockopt
    case QNativeSocketEngine::BindExclusively:          // not handled on Unix
    case QNativeSocketEngine::MaxStreamsSocketOption:
        Q_UNREACHABLE();

    case QNativeSocketEngine::BroadcastSocketOption:
        n = SO_BROADCAST;
        break;
    case QNativeSocketEngine::ReceiveBufferSocketOption:
        n = SO_RCVBUF;
        break;
    case QNativeSocketEngine::SendBufferSocketOption:
        n = SO_SNDBUF;
        break;
    case QNativeSocketEngine::AddressReusable:
        n = SO_REUSEADDR;
        break;
    case QNativeSocketEngine::ReceiveOutOfBandData:
        n = SO_OOBINLINE;
        break;
    case QNativeSocketEngine::LowDelayOption:
        level = IPPROTO_TCP;
        n = TCP_NODELAY;
        break;
    case QNativeSocketEngine::KeepAliveOption:
        n = SO_KEEPALIVE;
        break;
    case QNativeSocketEngine::MulticastTtlOption:
        if (socketProtocol == QAbstractSocket::IPv6Protocol || socketProtocol == QAbstractSocket::AnyIPProtocol) {
            level = IPPROTO_IPV6;
            n = IPV6_MULTICAST_HOPS;
        } else
        {
            level = IPPROTO_IP;
            n = IP_MULTICAST_TTL;
        }
        break;
    case QNativeSocketEngine::MulticastLoopbackOption:
        if (socketProtocol == QAbstractSocket::IPv6Protocol || socketProtocol == QAbstractSocket::AnyIPProtocol) {
            level = IPPROTO_IPV6;
            n = IPV6_MULTICAST_LOOP;
        } else
        {
            level = IPPROTO_IP;
            n = IP_MULTICAST_LOOP;
        }
        break;
    case QNativeSocketEngine::TypeOfServiceOption:
        if (socketProtocol == QAbstractSocket::IPv4Protocol) {
            level = IPPROTO_IP;
            n = IP_TOS;
        }
        break;
    case QNativeSocketEngine::ReceivePacketInformation:
        if (socketProtocol == QAbstractSocket::IPv6Protocol || socketProtocol == QAbstractSocket::AnyIPProtocol) {
            level = IPPROTO_IPV6;
            n = IPV6_RECVPKTINFO;
        } else if (socketProtocol == QAbstractSocket::IPv4Protocol) {
            level = IPPROTO_IP;
#ifdef IP_PKTINFO
            n = IP_PKTINFO;
#elif defined(IP_RECVDSTADDR)
            // variant found in QNX and FreeBSD; it will get us only the
            // destination address, not the interface; we need IP_RECVIF for that.
            n = IP_RECVDSTADDR;
#endif
        }
        break;
    case QNativeSocketEngine::ReceiveHopLimit:
        if (socketProtocol == QAbstractSocket::IPv6Protocol || socketProtocol == QAbstractSocket::AnyIPProtocol) {
            level = IPPROTO_IPV6;
            n = IPV6_RECVHOPLIMIT;
        } else if (socketProtocol == QAbstractSocket::IPv4Protocol) {
#ifdef IP_RECVTTL               // IP_RECVTTL is a non-standard extension supported on some OS
            level = IPPROTO_IP;
            n = IP_RECVTTL;
#endif
        }
        break;

    case QNativeSocketEngine::PathMtuInformation:
        if (socketProtocol == QAbstractSocket::IPv6Protocol || socketProtocol == QAbstractSocket::AnyIPProtocol) {
#ifdef IPV6_MTU
            level = IPPROTO_IPV6;
            n = IPV6_MTU;
#endif
        } else {
#ifdef IP_MTU
            level = IPPROTO_IP;
            n = IP_MTU;
#endif
        }
        break;
    }
}